

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

uint parse_hex4(uchar *input)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  iVar2 = 0;
  lVar3 = -4;
  while( true ) {
    bVar1 = input[lVar3 + 4];
    iVar4 = -0x30;
    if (((9 < (byte)(bVar1 - 0x30)) && (iVar4 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
       (iVar4 = -0x57, 5 < (byte)(bVar1 + 0x9f))) break;
    uVar5 = iVar4 + iVar2 + (uint)bVar1;
    iVar2 = uVar5 * 0x10;
    lVar3 = lVar3 + 1;
    if (lVar3 == 0) {
      return uVar5;
    }
  }
  return 0;
}

Assistant:

static unsigned parse_hex4(const unsigned char * const input)
{
    unsigned int h = 0;
    size_t i = 0;

    for (i = 0; i < 4; i++)
    {
        /* parse digit */
        if ((input[i] >= '0') && (input[i] <= '9'))
        {
            h += (unsigned int) input[i] - '0';
        }
        else if ((input[i] >= 'A') && (input[i] <= 'F'))
        {
            h += (unsigned int) 10 + input[i] - 'A';
        }
        else if ((input[i] >= 'a') && (input[i] <= 'f'))
        {
            h += (unsigned int) 10 + input[i] - 'a';
        }
        else /* invalid */
        {
            return 0;
        }

        if (i < 3)
        {
            /* shift left to make place for the next nibble */
            h = h << 4;
        }
    }

    return h;
}